

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  ImDrawVert *__src;
  ImWchar *__src_00;
  ImDrawVert *__dest;
  ImWchar *__dest_00;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  
  if ((0xffff < this->_VtxCurrentIdx + vtx_count) && ((this->Flags & 8) != 0)) {
    (this->_CmdHeader).VtxOffset = (this->VtxBuffer).Size;
    _OnChangedVtxOffset(this);
  }
  puVar1 = &(this->CmdBuffer).Data[(long)(this->CmdBuffer).Size + -1].ElemCount;
  *puVar1 = *puVar1 + idx_count;
  iVar2 = (this->VtxBuffer).Size;
  iVar9 = vtx_count + iVar2;
  iVar3 = (this->VtxBuffer).Capacity;
  if (iVar3 < iVar9) {
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar8 <= iVar9) {
      iVar8 = iVar9;
    }
    if (iVar3 < iVar8) {
      __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar8 * 0x14);
      __src = (this->VtxBuffer).Data;
      if (__src != (ImDrawVert *)0x0) {
        memcpy(__dest,__src,(long)(this->VtxBuffer).Size * 0x14);
        ImGui::MemFree((this->VtxBuffer).Data);
      }
      (this->VtxBuffer).Data = __dest;
      (this->VtxBuffer).Capacity = iVar8;
    }
  }
  (this->VtxBuffer).Size = iVar9;
  this->_VtxWritePtr = (this->VtxBuffer).Data + iVar2;
  wVar4 = (this->IdxBuffer).Size;
  wVar6 = idx_count + wVar4;
  wVar5 = (this->IdxBuffer).Capacity;
  if (wVar5 < wVar6) {
    if (wVar5 == L'\0') {
      wVar7 = L'\b';
    }
    else {
      wVar7 = wVar5 / 2 + wVar5;
    }
    if (wVar7 <= wVar6) {
      wVar7 = wVar6;
    }
    if (wVar5 < wVar7) {
      __dest_00 = (ImWchar *)ImGui::MemAlloc((long)wVar7 * 2);
      __src_00 = (this->IdxBuffer).Data;
      if (__src_00 != (ImWchar *)0x0) {
        memcpy(__dest_00,__src_00,(long)(this->IdxBuffer).Size * 2);
        ImGui::MemFree((this->IdxBuffer).Data);
      }
      (this->IdxBuffer).Data = __dest_00;
      (this->IdxBuffer).Capacity = wVar7;
    }
  }
  (this->IdxBuffer).Size = wVar6;
  this->_IdxWritePtr = (this->IdxBuffer).Data + wVar4;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    // Large mesh support (when enabled)
    IM_ASSERT_PARANOID(idx_count >= 0 && vtx_count >= 0);
    if (sizeof(ImDrawIdx) == 2 && (_VtxCurrentIdx + vtx_count >= (1 << 16)) && (Flags & ImDrawListFlags_AllowVtxOffset))
    {
        // FIXME: In theory we should be testing that vtx_count <64k here.
        // In practice, RenderText() relies on reserving ahead for a worst case scenario so it is currently useful for us
        // to not make that check until we rework the text functions to handle clipping and large horizontal lines better.
        _CmdHeader.VtxOffset = VtxBuffer.Size;
        _OnChangedVtxOffset();
    }

    ImDrawCmd* draw_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    draw_cmd->ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}